

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

void lyb_read(uint8_t *buf,size_t count,lylyb_ctx *lybctx)

{
  lyd_lyb_sibling *local_58;
  lyd_lyb_sibling *local_48;
  lylyb_ctx *local_38;
  size_t to_read;
  lyd_lyb_sibling *empty;
  uint64_t u;
  lylyb_ctx *lybctx_local;
  size_t count_local;
  uint8_t *buf_local;
  
  lybctx_local = (lylyb_ctx *)count;
  count_local = (size_t)buf;
  if (lybctx == (lylyb_ctx *)0x0) {
    __assert_fail("lybctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0x76,"void lyb_read(uint8_t *, size_t, struct lylyb_ctx *)");
  }
  while( true ) {
    local_38 = lybctx_local;
    to_read = 0;
    empty = (lyd_lyb_sibling *)0x0;
    while( true ) {
      if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
        local_48 = (lyd_lyb_sibling *)0x0;
      }
      else {
        local_48 = *(lyd_lyb_sibling **)&lybctx->siblings[-1].inner_chunks;
      }
      if (local_48 <= empty) break;
      if (((lylyb_ctx *)lybctx->siblings[(long)empty].written <= local_38) &&
         (lybctx->siblings[(long)empty].position != 0)) {
        local_38 = (lylyb_ctx *)lybctx->siblings[(long)empty].written;
        to_read = (size_t)(lybctx->siblings + (long)empty);
      }
      empty = (lyd_lyb_sibling *)((long)&empty->written + 1);
    }
    if ((to_read == 0) && (lybctx_local == (lylyb_ctx *)0x0)) break;
    if (local_38 != (lylyb_ctx *)0x0) {
      if (count_local == 0) {
        ly_in_skip(lybctx->in,(size_t)local_38);
      }
      else {
        ly_in_read(lybctx->in,(void *)count_local,(size_t)local_38);
      }
      empty = (lyd_lyb_sibling *)0x0;
      while( true ) {
        if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
          local_58 = (lyd_lyb_sibling *)0x0;
        }
        else {
          local_58 = *(lyd_lyb_sibling **)&lybctx->siblings[-1].inner_chunks;
        }
        if (local_58 <= empty) break;
        lybctx->siblings[(long)empty].written =
             lybctx->siblings[(long)empty].written - (long)local_38;
        if (0xffff < lybctx->siblings[(long)empty].written) {
          __assert_fail("lybctx->siblings[u].written <= LYB_SIZE_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                        ,0x95,"void lyb_read(uint8_t *, size_t, struct lylyb_ctx *)");
        }
        empty = (lyd_lyb_sibling *)((long)&empty->written + 1);
      }
      lybctx_local = (lylyb_ctx *)((long)lybctx_local - (long)local_38);
      if (count_local != 0) {
        count_local = (long)&local_38->ctx + count_local;
      }
    }
    if (to_read != 0) {
      lyb_read_sibling_meta((lyd_lyb_sibling *)to_read,lybctx);
    }
  }
  return;
}

Assistant:

static void
lyb_read(uint8_t *buf, size_t count, struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lyd_lyb_sibling *empty;
    size_t to_read;

    assert(lybctx);

    while (1) {
        /* check for fully-read (empty) data chunks */
        to_read = count;
        empty = NULL;
        LY_ARRAY_FOR(lybctx->siblings, u) {
            /* we want the innermost chunks resolved first, so replace previous empty chunks,
             * also ignore chunks that are completely finished, there is nothing for us to do */
            if ((lybctx->siblings[u].written <= to_read) && lybctx->siblings[u].position) {
                /* empty chunk, do not read more */
                to_read = lybctx->siblings[u].written;
                empty = &lybctx->siblings[u];
            }
        }

        if (!empty && !count) {
            break;
        }

        /* we are actually reading some data, not just finishing another chunk */
        if (to_read) {
            if (buf) {
                ly_in_read(lybctx->in, buf, to_read);
            } else {
                ly_in_skip(lybctx->in, to_read);
            }

            LY_ARRAY_FOR(lybctx->siblings, u) {
                /* decrease all written counters */
                lybctx->siblings[u].written -= to_read;
                assert(lybctx->siblings[u].written <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_read;
            if (buf) {
                buf += to_read;
            }
        }

        if (empty) {
            /* read the next chunk meta information */
            lyb_read_sibling_meta(empty, lybctx);
        }
    }
}